

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.cpp
# Opt level: O0

void __thiscall Polynom<Finite>::strip(Polynom<Finite> *this)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  Matrix<Finite> *in_RDI;
  Matrix<Finite> *unaff_retaddr;
  uint in_stack_00000008;
  uint in_stack_0000000c;
  uint in_stack_00000010;
  uint in_stack_00000014;
  Matrix<Finite> *in_stack_00000018;
  uint p;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  byte local_41;
  MatrixRow<Finite_&> local_18;
  uint local_c;
  
  local_c = 0;
  while( true ) {
    uVar1 = local_c;
    uVar3 = Matrix<Finite>::width(in_RDI);
    local_41 = 0;
    if (uVar1 < uVar3 - 1) {
      local_18.arr = (Finite *)
                     Matrix<Finite>::operator[]
                               ((Matrix<Finite> *)
                                CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
      Matrix<Finite>::MatrixRow<Finite_&>::operator[](&local_18,local_c);
      bVar2 = Finite::operator_cast_to_bool((Finite *)0x17a537);
      local_41 = bVar2 ^ 0xff;
    }
    if ((local_41 & 1) == 0) break;
    local_c = local_c + 1;
  }
  if (local_c != 0) {
    Matrix<Finite>::width(in_RDI);
    Matrix<Finite>::submatrix
              (in_stack_00000018,in_stack_00000014,in_stack_00000010,in_stack_0000000c,
               in_stack_00000008);
    Matrix<Finite>::operator=
              ((Matrix<Finite> *)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr);
    Matrix<Finite>::~Matrix(in_RDI);
  }
  return;
}

Assistant:

void Polynom<Field>::strip()
{
    unsigned p = 0;
    while(p < m.width() - 1 && !m[0][p])
        ++p;
    if(p)
        m = m.submatrix(0, p, 0, m.width() - 1);
}